

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_JavascriptEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  int iVar11;
  char *pcVar12;
  TemplateString local_290;
  TemplateString local_270;
  TemplateString local_250;
  TemplateString local_230;
  TemplateString local_210;
  TemplateDictionaryPeer local_1f0;
  TemplateDictionaryPeer peer;
  size_t sStack_1e0;
  undefined8 local_1d8;
  TemplateId TStack_1d0;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestJavascriptEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"easy JS");
  ctemplate::TemplateString::TemplateString(&local_e8,"joo");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar6.length_ = local_e8.length_;
  TVar6.ptr_ = local_e8.ptr_;
  TVar6.is_immutable_ = local_e8.is_immutable_;
  TVar6._17_7_ = local_e8._17_7_;
  TVar6.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar6,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"harder JS");
  ctemplate::TemplateString::TemplateString(&local_128,"f = \'joo\';");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar7.length_ = local_128.length_;
  TVar7.ptr_ = local_128.ptr_;
  TVar7.is_immutable_ = local_128.is_immutable_;
  TVar7._17_7_ = local_128._17_7_;
  TVar7.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar7,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"hardest JS");
  ctemplate::TemplateString::TemplateString
            (&local_168,"f = \'foo\f\';\r\n\tprint \"\\&foo = \b\", \"foo\"");
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar8.length_ = local_168.length_;
  TVar8.ptr_ = local_168.ptr_;
  TVar8.is_immutable_ = local_168.is_immutable_;
  TVar8._17_7_ = local_168._17_7_;
  TVar8.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar8,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_188,"close script JS");
  ctemplate::TemplateString::TemplateString(&local_1a8,"//--></script><script>alert(123);</script>")
  ;
  TVar4.length_ = local_188.length_;
  TVar4.ptr_ = local_188.ptr_;
  TVar4.is_immutable_ = local_188.is_immutable_;
  TVar4._17_7_ = local_188._17_7_;
  TVar4.id_ = local_188.id_;
  TVar9.length_ = local_1a8.length_;
  TVar9.ptr_ = local_1a8.ptr_;
  TVar9.is_immutable_ = local_1a8.is_immutable_;
  TVar9._17_7_ = local_1a8._17_7_;
  TVar9.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar9,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_1c8,"unicode codepoints");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,anon_var_dwarf_3988);
  TVar5.length_ = local_1c8.length_;
  TVar5.ptr_ = local_1c8.ptr_;
  TVar5.is_immutable_ = local_1c8.is_immutable_;
  TVar5._17_7_ = local_1c8._17_7_;
  TVar5.id_ = local_1c8.id_;
  TVar10.length_ = sStack_1e0;
  TVar10.ptr_ = (char *)peer.dict_;
  TVar10._16_8_ = local_1d8;
  TVar10.id_ = TStack_1d0;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar10,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_1f0,local_78);
  ctemplate::TemplateString::TemplateString(&local_210,"easy JS");
  pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1f0,&local_210);
  iVar11 = strcmp(pcVar12,"joo");
  if (iVar11 != 0) {
    fprintf(_stderr,"Check failed: %s\n","strcmp(peer.GetSectionValue(\"easy JS\"), \"joo\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_230,"harder JS");
  pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1f0,&local_230);
  iVar11 = strcmp(pcVar12,"f \\x3d \\x27joo\\x27;");
  if (iVar11 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder JS\"), \"f \\\\x3d \\\\x27joo\\\\x27;\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_250,"hardest JS");
  pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1f0,&local_250);
  iVar11 = strcmp(pcVar12,
                  "f \\x3d \\x27foo\\f\\x27;\\r\\n\\tprint \\x22\\\\\\x26foo \\x3d \\b\\x22, \\x22foo\\x22"
                 );
  if (iVar11 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"hardest JS\"), \"f \\\\x3d \\\\x27foo\\\\f\\\\x27;\\\\r\\\\n\\\\tprint \\\\x22\\\\\\\\\\\\x26foo \" \"\\\\x3d \\\\b\\\\x22, \\\\x22foo\\\\x22\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_270,"close script JS");
  pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1f0,&local_270);
  iVar11 = strcmp(pcVar12,"//--\\x3e\\x3c/script\\x3e\\x3cscript\\x3ealert(123);\\x3c/script\\x3e");
  if (iVar11 == 0) {
    ctemplate::TemplateString::TemplateString(&local_290,"unicode codepoints");
    pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_1f0,&local_290);
    iVar11 = strcmp(pcVar12,anon_var_dwarf_3a0c);
    if (iVar11 == 0) {
      ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
      return;
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unicode codepoints\"), \"line1\" \"\\\\u2028\" \"line2\" \"\\\\u2029\" \"line3\" \"\\xe2\\x80\\xa7\" \"\\xe2\\x80\\xaa\" \"\\xe2\" \"\\\\u2028\" \"\\xe2\\x80\") == 0"
           );
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"close script JS\"), \"//--\\\\x3e\\\\x3c/script\\\\x3e\\\\x3cscript\\\\x3e\" \"alert(123);\\\\x3c/script\\\\x3e\") == 0"
         );
  exit(1);
}

Assistant:

TEST(TemplateModifiers, JavascriptEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestJavascriptEscape", NULL);
  dict.SetEscapedValue("easy JS", "joo",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("harder JS", "f = 'joo';",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("hardest JS",
                       ("f = 'foo\f';\r\n\tprint \"\\&foo = \b\", \"foo\""),
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("close script JS",
                       "//--></script><script>alert(123);</script>",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("unicode codepoints",
                       ("line1" "\xe2\x80\xa8" "line2" "\xe2\x80\xa9" "line3"
                        /* \u2027 */ "\xe2\x80\xa7"
                        /* \u202A */ "\xe2\x80\xaa"
                        /* malformed */ "\xe2" "\xe2\x80\xa8"
                        /* truncated */ "\xe2\x80"),
                       GOOGLE_NAMESPACE::javascript_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy JS"), "joo");
  EXPECT_STREQ(peer.GetSectionValue("harder JS"), "f \\x3d \\x27joo\\x27;");
  EXPECT_STREQ(peer.GetSectionValue("hardest JS"),
               "f \\x3d \\x27foo\\f\\x27;\\r\\n\\tprint \\x22\\\\\\x26foo "
               "\\x3d \\b\\x22, \\x22foo\\x22");
  EXPECT_STREQ(peer.GetSectionValue("close script JS"),
               "//--\\x3e\\x3c/script\\x3e\\x3cscript\\x3e"
               "alert(123);\\x3c/script\\x3e");
  EXPECT_STREQ(peer.GetSectionValue("unicode codepoints"),
               "line1" "\\u2028" "line2" "\\u2029" "line3"
               "\xe2\x80\xa7"
               "\xe2\x80\xaa"
               "\xe2" "\\u2028"
               "\xe2\x80");
}